

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint *puVar1;
  string latticeType_00;
  bool bVar2;
  int iVar3;
  int rounds;
  int sweepLimit;
  int timeout;
  int iVar4;
  ostream *poVar5;
  istream *piVar6;
  long lVar7;
  long lVar8;
  invalid_argument *this;
  ulong uVar9;
  ulong uVar10;
  double p;
  double q;
  undefined1 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbd0;
  bool correlatedErrors;
  bool greedy;
  vector<bool,_std::allocator<bool>_> succ;
  string latticeType;
  string local_3c8;
  string sweepSchedule;
  string local_388 [32];
  _Bvector_base<std::allocator<bool>_> local_368;
  stringstream ssc;
  uint auStack_328 [92];
  stringstream ssg;
  uint auStack_1a0 [92];
  
  if (argc < 0xb) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Fewer than eleven arguments");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar9 = 0;
    uVar10 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar10 = uVar9;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Argument ");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)uVar9);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::operator<<(poVar5,argv[uVar9]);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    iVar3 = 1;
  }
  else {
    iVar3 = atoi(argv[1]);
    p = atof(argv[2]);
    q = atof(argv[3]);
    rounds = atoi(argv[4]);
    std::__cxx11::string::string((string *)&latticeType,argv[5],(allocator *)&ssg);
    sweepLimit = atoi(argv[6]);
    std::__cxx11::string::string((string *)&sweepSchedule,argv[7],(allocator *)&ssg);
    timeout = atoi(argv[8]);
    std::__cxx11::string::string((string *)&ssc,argv[9],(allocator *)&succ);
    std::__cxx11::stringstream::stringstream((stringstream *)&ssg,(string *)&ssc,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&ssc);
    puVar1 = (uint *)((long)auStack_1a0 + *(long *)(_ssg + -0x18));
    *puVar1 = *puVar1 | 1;
    piVar6 = std::istream::_M_extract<bool>((bool *)&ssg);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      std::__cxx11::string::string((string *)&succ,argv[10],(allocator *)&local_368);
      std::__cxx11::stringstream::stringstream((stringstream *)&ssc,(string *)&succ,_S_out|_S_in);
      std::__cxx11::string::~string((string *)&succ);
      puVar1 = (uint *)((long)auStack_328 + *(long *)(_ssc + -0x18));
      *puVar1 = *puVar1 | 1;
      piVar6 = std::istream::_M_extract<bool>((bool *)&ssc);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
        succ.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        succ.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_offset = 0;
        succ.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        succ.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_offset = 0;
        succ.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        iVar4 = atoi(argv[0xb]);
        lVar7 = std::chrono::_V2::system_clock::now();
        bVar2 = std::operator==(&latticeType,"rhombic_boundaries");
        if ((((!bVar2) && (bVar2 = std::operator==(&latticeType,"cubic_boundaries"), !bVar2)) &&
            (bVar2 = std::operator==(&latticeType,"rhombic_toric"), !bVar2)) &&
           (bVar2 = std::operator==(&latticeType,"cubic_toric"), !bVar2)) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this,"Invalid lattice type.");
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        std::__cxx11::string::string((string *)&local_3c8,(string *)&sweepSchedule);
        std::__cxx11::string::string(local_388,(string *)&latticeType);
        latticeType_00._M_string_length._0_1_ = greedy;
        latticeType_00._M_dataplus._M_p = (pointer)local_388;
        latticeType_00._M_string_length._1_7_ = 0;
        latticeType_00.field_2._M_local_buf[0] = correlatedErrors;
        latticeType_00.field_2._M_allocated_capacity._1_7_ = 0;
        latticeType_00.field_2._8_4_ = iVar4;
        latticeType_00.field_2._12_4_ = 0;
        oneRun((vector<bool,_std::allocator<bool>_> *)&local_368,iVar3,rounds,p,q,sweepLimit,
               &local_3c8,timeout,latticeType_00,(bool)in_stack_fffffffffffffbc8,
               (bool)in_stack_fffffffffffffbd0,
               (int)succ.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_start.super__Bit_iterator_base._M_p);
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (&succ,(vector<bool,_std::allocator<bool>_> *)&local_368);
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_368);
        std::__cxx11::string::~string(local_388);
        std::__cxx11::string::~string((string *)&local_3c8);
        lVar8 = std::chrono::_V2::system_clock::now();
        std::vector<bool,_std::allocator<bool>_>::operator[](&succ,0);
        poVar5 = std::ostream::_M_insert<bool>(true);
        poVar5 = std::operator<<(poVar5,", ");
        std::vector<bool,_std::allocator<bool>_>::operator[](&succ,1);
        poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
        std::operator<<(poVar5,", ");
        poVar5 = std::ostream::_M_insert<double>((double)(lVar8 - lVar7) / 1000000000.0);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&succ.super__Bvector_base<std::allocator<bool>_>);
        iVar3 = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Incorrect argument provided (boolean).");
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar3 = 1;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ssc);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Incorrect argument provided (boolean).");
      std::endl<char,std::char_traits<char>>(poVar5);
      iVar3 = 1;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ssg);
    std::__cxx11::string::~string((string *)&sweepSchedule);
    std::__cxx11::string::~string((string *)&latticeType);
  }
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 11)
    {
        std::cout << "Fewer than eleven arguments" << std::endl;
        for (int i = 0; i < argc; ++i)
        {
            std::cout << "Argument " << i << " = " << argv[i] << std::endl;
        }
        return 1;
    }

    int l = std::atoi(argv[1]);
    double p = std::atof(argv[2]);
    double q = std::atof(argv[3]);
    // std::string sweepDir(argv[4]);
    int rounds = std::atoi(argv[4]);
    std::string latticeType(argv[5]);
    int sweepLimit = std::atoi(argv[6]);
    std::string sweepSchedule(argv[7]);
    int timeout = std::atoi(argv[8]);
    bool greedy;
    std::stringstream ssg(argv[9]);
    if (!(ssg >> std::boolalpha >> greedy))
    {
        std::cerr << "Incorrect argument provided (boolean)." << std::endl;
        return 1;
    }
    bool correlatedErrors;
    std::stringstream ssc(argv[10]);
    if (!(ssc >> std::boolalpha >> correlatedErrors))
    {
        std::cerr << "Incorrect argument provided (boolean)." << std::endl;
        return 1;
    }
    std::vector<bool> succ;
    int sweepRate = std::atoi(argv[11]);

    auto start = std::chrono::high_resolution_clock::now();
    // if (latticeType == "rhombic_toric")
    // {
    //     succ = runToric(l, rounds, p, q, sweepDir, timeout, greedy, correlatedErrors);
    // }
    // else if (latticeType == "rhombic_boundaries" || latticeType == "cubic_boundaries")
    if (latticeType == "rhombic_boundaries" || latticeType == "cubic_boundaries" || latticeType == "rhombic_toric" || latticeType == "cubic_toric")
    {
        // succ = runBoundaries(l, rounds, p, q, sweepLimit, sweepSchedule, timeout, latticeType, greedy, correlatedErrors);
        succ = oneRun(l, rounds, p, q, sweepLimit, sweepSchedule, timeout, latticeType, greedy, correlatedErrors, sweepRate);
    }
    else
    {
        throw std::invalid_argument("Invalid lattice type.");
    }
    auto finish = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double> elapsed = finish - start;

    std::cout << succ[0] << ", " // Decoding succeeded
              << succ[1] << ", " // Clean syndrome
              << elapsed.count() // "s" <<
              << std::endl;

    return 0;
}